

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QVariant * __thiscall
QGraphicsItem::data(QVariant *__return_storage_ptr__,QGraphicsItem *this,int key)

{
  bool bVar1;
  QHash<const_QGraphicsItem_*,_QMap<int,_QVariant>_> *this_00;
  long in_FS_OFFSET;
  QMap<int,_QVariant> local_58;
  int local_4c;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_4c = key;
  this_00 = &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_dataStore>_>::
             operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_dataStore>_>
                         *)__return_storage_ptr__)->data;
  local_48.shared = (PrivateShared *)this;
  bVar1 = QHash<const_QGraphicsItem_*,_QMap<int,_QVariant>_>::contains
                    (this_00,(QGraphicsItem **)&local_48.shared);
  if (bVar1) {
    QHash<const_QGraphicsItem_*,_QMap<int,_QVariant>_>::value
              ((QHash<const_QGraphicsItem_*,_QMap<int,_QVariant>_> *)&local_58,
               (QGraphicsItem **)this_00);
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = 0;
    local_48._16_8_ = 0;
    local_30 = 2;
    QMap<int,_QVariant>::value(__return_storage_ptr__,&local_58,&local_4c,(QVariant *)&local_48);
    ::QVariant::~QVariant((QVariant *)&local_48);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_58.d);
  }
  else {
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGraphicsItem::data(int key) const
{
    QGraphicsItemCustomDataStore *store = qt_dataStore();
    if (!store->data.contains(this))
        return QVariant();
    return store->data.value(this).value(key);
}